

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O1

wchar_t archive_read_support_format_rar5(archive *_a)

{
  int iVar1;
  wchar_t wVar2;
  void *__s;
  void *pvVar3;
  
  iVar1 = __archive_check_magic(_a,0xdeb0c5,1,"archive_read_support_format_rar5");
  if (iVar1 != -0x1e) {
    __s = malloc(0x5340);
    if (__s == (void *)0x0) {
      archive_set_error(_a,0xc,"Can\'t allocate rar5 data");
    }
    else {
      memset(__s,0,0x5340);
      *(undefined8 *)((long)__s + 0x4b40) = 0;
      *(undefined8 *)((long)__s + 0x4b38) = 0x1fff00000000;
      pvVar3 = malloc(0x10000);
      *(void **)((long)__s + 0x4b40) = pvVar3;
      if (pvVar3 != (void *)0x0) {
        *(undefined4 *)((long)__s + 0x5334) = 0xffffffff;
        wVar2 = __archive_read_register_format
                          ((archive_read *)_a,__s,"rar5",rar5_bid,rar5_options,rar5_read_header,
                           rar5_read_data,rar5_read_data_skip,rar5_seek_data,rar5_cleanup,
                           rar5_capabilities,rar5_has_encrypted_entries);
        if (wVar2 != L'\0') {
          rar5_cleanup((archive_read *)_a);
          return wVar2;
        }
        return L'\0';
      }
      archive_set_error(_a,0xc,"Can\'t allocate rar5 filter buffer");
      free(__s);
    }
  }
  return L'\xffffffe2';
}

Assistant:

int archive_read_support_format_rar5(struct archive *_a) {
	struct archive_read* ar;
	int ret;
	struct rar5* rar;

	if(ARCHIVE_OK != (ret = get_archive_read(_a, &ar)))
		return ret;

	rar = malloc(sizeof(*rar));
	if(rar == NULL) {
		archive_set_error(&ar->archive, ENOMEM,
		    "Can't allocate rar5 data");
		return ARCHIVE_FATAL;
	}

	if(ARCHIVE_OK != rar5_init(rar)) {
		archive_set_error(&ar->archive, ENOMEM,
		    "Can't allocate rar5 filter buffer");
		free(rar);
		return ARCHIVE_FATAL;
	}

	ret = __archive_read_register_format(ar,
	    rar,
	    "rar5",
	    rar5_bid,
	    rar5_options,
	    rar5_read_header,
	    rar5_read_data,
	    rar5_read_data_skip,
	    rar5_seek_data,
	    rar5_cleanup,
	    rar5_capabilities,
	    rar5_has_encrypted_entries);

	if(ret != ARCHIVE_OK) {
		(void) rar5_cleanup(ar);
	}

	return ret;
}